

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

string * google::protobuf::compiler::js::anon_unknown_0::ToUpperCamel
                   (string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *words)

{
  pointer pbVar1;
  long lVar2;
  ulong uVar3;
  string word;
  char *local_48 [4];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  lVar2 = 0;
  for (uVar3 = 0;
      pbVar1 = (words->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(words->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
      uVar3 = uVar3 + 1) {
    std::__cxx11::string::string
              ((string *)local_48,(string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar2));
    if ((byte)(*local_48[0] + 0x9fU) < 0x1a) {
      *local_48[0] = *local_48[0] + -0x20;
    }
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)local_48);
    lVar2 = lVar2 + 0x20;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ToUpperCamel(const std::vector<std::string>& words) {
  std::string result;
  for (int i = 0; i < words.size(); i++) {
    std::string word = words[i];
    if (word[0] >= 'a' && word[0] <= 'z') {
      word[0] = (word[0] - 'a') + 'A';
    }
    result += word;
  }
  return result;
}